

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# uniset.cpp
# Opt level: O0

void __thiscall icu_63::UnicodeSet::UnicodeSet(UnicodeSet *this,UnicodeSet *o,UBool param_2)

{
  UBool UVar1;
  UChar32 *pUVar2;
  UnicodeString local_70;
  UErrorCode local_20;
  UBool local_19;
  UErrorCode status;
  UBool param_2_local;
  UnicodeSet *o_local;
  UnicodeSet *this_local;
  
  local_19 = param_2;
  _status = o;
  o_local = this;
  UnicodeFilter::UnicodeFilter(&this->super_UnicodeFilter,&o->super_UnicodeFilter);
  (this->super_UnicodeFilter).super_UnicodeFunctor.super_UObject._vptr_UObject =
       (_func_int **)&PTR__UnicodeSet_004fd8f0;
  (this->super_UnicodeFilter).super_UnicodeMatcher._vptr_UnicodeMatcher =
       (_func_int **)&PTR__UnicodeSet_004fda08;
  this->len = 0;
  this->capacity = _status->len + 0x10;
  this->list = (UChar32 *)0x0;
  this->bmpSet = (BMPSet *)0x0;
  this->buffer = (UChar32 *)0x0;
  this->bufferCapacity = 0;
  this->patLen = 0;
  this->pat = (char16_t *)0x0;
  this->strings = (UVector *)0x0;
  this->stringSpan = (UnicodeSetStringSpan *)0x0;
  this->fFlags = '\0';
  local_20 = U_ZERO_ERROR;
  allocateStrings(this,&local_20);
  UVar1 = ::U_FAILURE(local_20);
  if (UVar1 == '\0') {
    pUVar2 = (UChar32 *)uprv_malloc_63((long)this->capacity << 2);
    this->list = pUVar2;
    if (this->list == (UChar32 *)0x0) {
      setToBogus(this);
    }
    else {
      this->len = _status->len;
      memcpy(this->list,_status->list,(long)this->len << 2);
      if ((this->strings == (UVector *)0x0) || (_status->strings == (UVector *)0x0)) {
        setToBogus(this);
      }
      else {
        UVector::assign(this->strings,_status->strings,cloneUnicodeString,&local_20);
        if (_status->pat != (char16_t *)0x0) {
          UnicodeString::UnicodeString(&local_70,_status->pat,_status->patLen);
          setPattern(this,&local_70);
          UnicodeString::~UnicodeString(&local_70);
        }
      }
    }
  }
  else {
    setToBogus(this);
  }
  return;
}

Assistant:

UnicodeSet::UnicodeSet(const UnicodeSet& o, UBool /* asThawed */) :
    UnicodeFilter(o),
    len(0), capacity(o.len + GROW_EXTRA), list(0),
    bmpSet(0),
    buffer(0), bufferCapacity(0),
    patLen(0), pat(NULL), strings(NULL), stringSpan(NULL),
    fFlags(0)
{
    UErrorCode status = U_ZERO_ERROR;
    allocateStrings(status);
    if (U_FAILURE(status)) {
        setToBogus(); // If memory allocation failed, set to bogus state.
        return;
    }
    list = (UChar32*) uprv_malloc(sizeof(UChar32) * capacity);
    if(list!=NULL){
        // *this = o except for bmpSet and stringSpan
        len = o.len;
        uprv_memcpy(list, o.list, (size_t)len*sizeof(UChar32));
        if (strings != NULL && o.strings != NULL) {
            strings->assign(*o.strings, cloneUnicodeString, status);
        } else { // Invalid strings.
            setToBogus();
            return;
        }
        if (o.pat) {
            setPattern(UnicodeString(o.pat, o.patLen));
        }
    } else { // If memory allocation failed, set to bogus state.
        setToBogus();
        return;
    }
    _dbgct(this);
}